

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O1

LY_ERR nacm_inherit_clb(lysc_node *node,void *data,ly_bool *dfs_continue)

{
  void **ppvVar1;
  lysc_ext_instance *plVar2;
  lysc_ext **pplVar3;
  int iVar4;
  ly_stmt lVar5;
  LY_ERR LVar6;
  undefined8 *puVar7;
  void *pvVar8;
  lysc_ext_instance *plVar9;
  void *pvVar10;
  
  if ((*(lysc_node **)((long)data + 8) != node) && ((node->nodetype & 0x3000) == 0)) {
    plVar2 = node->exts;
    pvVar8 = (void *)0xffffffffffffffff;
    plVar9 = plVar2;
    do {
      if (plVar2 == (lysc_ext_instance *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = plVar2[-1].compiled;
      }
      pvVar8 = (void *)((long)pvVar8 + 1);
      if (pvVar10 <= pvVar8) {
        if (plVar2 == (lysc_ext_instance *)0x0) {
          puVar7 = (undefined8 *)malloc(0x50);
          if (puVar7 == (undefined8 *)0x0) goto LAB_001a1fd6;
          *puVar7 = 1;
        }
        else {
          pvVar8 = plVar2[-1].compiled;
          plVar2[-1].compiled = (void *)((long)pvVar8 + 1);
          puVar7 = (undefined8 *)realloc(&plVar2[-1].compiled,(long)pvVar8 * 0x48 + 0x50);
          if (puVar7 == (undefined8 *)0x0) {
            ppvVar1 = &node->exts[-1].compiled;
            *ppvVar1 = (void *)((long)*ppvVar1 + -1);
LAB_001a1fd6:
            iVar4 = 5;
            goto LAB_001a1fdb;
          }
        }
        node->exts = (lysc_ext_instance *)(puVar7 + 1);
        iVar4 = 0;
LAB_001a1fdb:
        if (iVar4 == 5) {
          lyplg_ext_compile_log
                    ((lysc_ctx *)0x0,*data,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "nacm_inherit_clb");
          return LY_EMEM;
        }
        if (iVar4 == 0) {
          plVar2 = node->exts;
          pvVar8 = plVar2[-1].compiled;
          plVar2[(long)pvVar8 + -1].parent_stmt_index = 0;
          plVar2[(long)pvVar8 + -1].substmts = (lysc_ext_substmt *)0x0;
          plVar2[(long)pvVar8 + -1].parent = (void *)0x0;
          *(undefined8 *)&plVar2[(long)pvVar8 + -1].parent_stmt = 0;
          plVar2[(long)pvVar8 + -1].module = (lys_module *)0x0;
          plVar2[(long)pvVar8 + -1].exts = (lysc_ext_instance *)0x0;
          plVar2[(long)pvVar8 + -1].def = (lysc_ext *)0x0;
          plVar2[(long)pvVar8 + -1].argument = (char *)0x0;
          plVar2[(long)pvVar8 + -1].compiled = (void *)0x0;
          plVar2[(long)pvVar8 + -1].def = (lysc_ext *)**data;
          plVar2[(long)pvVar8 + -1].parent = node;
          lVar5 = lyplg_ext_nodetype2stmt(node->nodetype);
          plVar2[(long)pvVar8 + -1].parent_stmt = lVar5;
          if ((*(char **)(*data + 8) != (char *)0x0) &&
             (LVar6 = lydict_insert(node->module->ctx,*(char **)(*data + 8),0,
                                    &plVar2[(long)pvVar8 + -1].argument), LVar6 != LY_SUCCESS)) {
            return LVar6;
          }
          plVar2[(long)pvVar8 + -1].compiled = *(void **)(*data + 0x40);
          return LY_SUCCESS;
        }
        return LY_SUCCESS;
      }
      pplVar3 = &plVar9->def;
      plVar9 = plVar9 + 1;
    } while (*pplVar3 != (lysc_ext *)**data);
    *dfs_continue = '\x01';
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
nacm_inherit_clb(struct lysc_node *node, void *data, ly_bool *dfs_continue)
{
    LY_ERR ret;
    struct nacm_dfs_arg *arg = data;
    struct lysc_ext_instance *inherited;
    LY_ARRAY_COUNT_TYPE u;

    /* ignore the parent from which we inherit and input/output nodes */
    if ((node != arg->parent) && !(node->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
        /* check that the node does not have its own NACM extension instance */
        LY_ARRAY_FOR(node->exts, u) {
            if (node->exts[u].def == arg->ext->def) {
                /* the child already have its own NACM flag, so skip the subtree */
                *dfs_continue = 1;
                return LY_SUCCESS;
            }
        }

        /* duplicate this one to inherit it to the child */
        LY_ARRAY_NEW_GOTO(node->module->ctx, node->exts, inherited, ret, emem);

        inherited->def = arg->ext->def;
        inherited->parent = node;
        inherited->parent_stmt = lyplg_ext_nodetype2stmt(node->nodetype);
        if (arg->ext->argument) {
            if ((ret = lydict_insert(node->module->ctx, arg->ext->argument, 0, &inherited->argument))) {
                return ret;
            }
        }
        /* copy the pointer to the static variables */
        inherited->compiled = arg->ext->compiled;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(NULL, arg->ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return ret;
}